

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * __thiscall
kj::strTree<float,char_const(&)[6],double,char_const(&)[6],int>
          (StringTree *__return_storage_ptr__,kj *this,float *params,char (*params_1) [6],
          double *params_2,char (*params_3) [6],int *params_4)

{
  CappedArray<char,_14UL> *in_stack_ffffffffffffff48;
  ArrayPtr<const_char> local_b0;
  ArrayPtr<const_char> local_a0;
  StringTree local_90;
  CappedArray<char,_32UL> local_58;
  
  toCharSequence<float>((CappedArray<char,_24UL> *)&local_90,(float *)this);
  local_a0 = toCharSequence<char_const(&)[6]>((char (*) [6])params);
  toCharSequence<double>(&local_58,(double *)params_1);
  local_b0 = toCharSequence<char_const(&)[6]>((char (*) [6])params_2);
  toCharSequence<int>((CappedArray<char,_14UL> *)&local_90.branches,(int *)params_3);
  StringTree::
  concat<kj::CappedArray<char,24ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,32ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>>
            (__return_storage_ptr__,&local_90,(CappedArray<char,_24UL> *)&local_a0,
             (ArrayPtr<const_char> *)&local_58,(CappedArray<char,_32UL> *)&local_b0,
             (ArrayPtr<const_char> *)&local_90.branches,in_stack_ffffffffffffff48);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}